

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O0

void project_feature_handler_KILL_WALL(project_feature_handler_context_t *context)

{
  loc_conflict grid_00;
  chunk_conflict *c;
  player *p;
  _Bool _Var1;
  uint32_t uVar2;
  object *poVar3;
  loc_conflict grid;
  project_feature_handler_context_t *context_local;
  
  grid_00 = context->grid;
  _Var1 = square_ispassable((chunk *)cave,grid_00);
  if (((!_Var1) || (_Var1 = square_seemslikewall((chunk *)cave,grid_00), _Var1)) &&
     (_Var1 = square_isperm((chunk *)cave,grid_00), !_Var1)) {
    _Var1 = square_isrubble((chunk *)cave,grid_00);
    if (_Var1) {
      _Var1 = square_isseen((chunk *)cave,grid_00);
      if (_Var1) {
        msg("The rubble turns into mud!");
        context->obvious = true;
        square_forget((chunk *)cave,grid_00);
      }
      square_destroy_rubble((chunk *)cave,grid_00);
      uVar2 = Rand_div(100);
      if ((int)uVar2 < 10) {
        place_object(cave,(loc)grid_00,(int)player->depth,false,false,'\b',L'\0');
        poVar3 = square_object((chunk *)cave,grid_00);
        p = player;
        if (poVar3 != (object *)0x0) {
          poVar3 = square_object((chunk *)cave,grid_00);
          _Var1 = ignore_item_ok(p,poVar3);
          if ((!_Var1) && (_Var1 = square_isseen((chunk *)cave,grid_00), _Var1)) {
            msg("There was something buried in the rubble!");
            context->obvious = true;
          }
        }
      }
    }
    else {
      _Var1 = square_isdoor((chunk *)cave,grid_00);
      if (_Var1) {
        _Var1 = square_isseen((chunk *)cave,grid_00);
        if (_Var1) {
          msg("The door turns into mud!");
          context->obvious = true;
          square_forget((chunk *)cave,grid_00);
        }
        square_destroy_door((chunk *)cave,grid_00);
      }
      else {
        _Var1 = square_hasgoldvein((chunk *)cave,grid_00);
        if (_Var1) {
          _Var1 = square_isseen((chunk *)cave,grid_00);
          if (_Var1) {
            msg("The vein turns into mud!");
            msg("You have found something!");
            context->obvious = true;
            square_forget((chunk *)cave,grid_00);
          }
          square_destroy_wall((chunk *)cave,grid_00);
          place_gold(cave,(loc)grid_00,(int)player->depth,'\x01');
        }
        else {
          _Var1 = square_ismagma((chunk *)cave,grid_00);
          if ((_Var1) || (_Var1 = square_isquartz((chunk *)cave,grid_00), _Var1)) {
            _Var1 = square_isseen((chunk *)cave,grid_00);
            if (_Var1) {
              msg("The vein turns into mud!");
              context->obvious = true;
              square_forget((chunk *)cave,grid_00);
            }
            square_destroy_wall((chunk *)cave,grid_00);
          }
          else {
            _Var1 = square_isgranite((chunk *)cave,grid_00);
            if (_Var1) {
              _Var1 = square_isseen((chunk *)cave,grid_00);
              if (_Var1) {
                msg("The wall turns into mud!");
                context->obvious = true;
                square_forget((chunk *)cave,grid_00);
              }
              square_destroy_wall((chunk *)cave,grid_00);
            }
          }
        }
      }
    }
    c = cave;
    if (cave->depth == 0) {
      _Var1 = is_daytime();
      expose_to_sun((chunk *)c,(loc)grid_00,_Var1);
    }
    player->upkeep->update = player->upkeep->update | 0xc0;
  }
  return;
}

Assistant:

static void project_feature_handler_KILL_WALL(project_feature_handler_context_t *context)
{
	const struct loc grid = context->grid;

	/* Non-walls (etc) */
	if (square_ispassable(cave, grid) && !square_seemslikewall(cave, grid))
		return;

	/* Permanent walls */
	if (square_isperm(cave, grid)) return;

	/* Different treatment for different walls */
	if (square_isrubble(cave, grid)) {
		/* Message */
		if (square_isseen(cave, grid)) {
			msg("The rubble turns into mud!");
			context->obvious = true;

			/* Forget the wall */
			square_forget(cave, grid);
		}

		/* Destroy the rubble */
		square_destroy_rubble(cave, grid);

		/* Hack -- place an object */
		if (randint0(100) < 10){
			place_object(cave, grid, player->depth, false, false,
						 ORIGIN_RUBBLE, 0);
			if (square_object(cave, grid)
					&& !ignore_item_ok(player,
					square_object(cave, grid))
					&& square_isseen(cave, grid)) {
				msg("There was something buried in the rubble!");
				context->obvious = true;
			}
		}
	} else if (square_isdoor(cave, grid)) {
		/* Hack -- special message */
		if (square_isseen(cave, grid)) {
			msg("The door turns into mud!");
			context->obvious = true;

			/* Forget the wall */
			square_forget(cave, grid);
		}

		/* Destroy the feature */
		square_destroy_door(cave, grid);
	} else if (square_hasgoldvein(cave, grid)) {
		/* Message */
		if (square_isseen(cave, grid)) {
			msg("The vein turns into mud!");
			msg("You have found something!");
			context->obvious = true;

			/* Forget the wall */
			square_forget(cave, grid);
		}

		/* Destroy the wall */
		square_destroy_wall(cave, grid);

		/* Place some gold */
		place_gold(cave, grid, player->depth, ORIGIN_FLOOR);
	} else if (square_ismagma(cave, grid) || square_isquartz(cave, grid)) {
		/* Message */
		if (square_isseen(cave, grid)) {
			msg("The vein turns into mud!");
			context->obvious = true;

			/* Forget the wall */
			square_forget(cave, grid);
		}

		/* Destroy the wall */
		square_destroy_wall(cave, grid);
	} else if (square_isgranite(cave, grid)) {
		/* Message */
		if (square_isseen(cave, grid)) {
			msg("The wall turns into mud!");
			context->obvious = true;

			/* Forget the wall */
			square_forget(cave, grid);
		}

		/* Destroy the wall */
		square_destroy_wall(cave, grid);
	}

	/* On the surface, new terrain may be exposed to the sun. */
	if (cave->depth == 0) expose_to_sun(cave, grid, is_daytime());

	/* Update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
}